

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_perform_authentication(connectdata *conn)

{
  uint *sasl;
  _Bool _Var1;
  uint in_EAX;
  CURLcode CVar2;
  curl_ftpfile cVar3;
  saslprogress progress;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  sasl = &(conn->proto).imapc.sasl.prefmech;
  _Var1 = Curl_sasl_can_authenticate((SASL *)sasl,conn);
  if (!_Var1) {
    (conn->proto).imapc.state = IMAP_STOP;
    return CURLE_OK;
  }
  if (((conn->proto).ftpc.prevmethod & (conn->proto).pop3c.preftype & 4) != 0) {
    CVar2 = Curl_sasl_start((SASL *)sasl,conn,false,(saslprogress *)((long)&uStack_18 + 4));
    if ((CVar2 != CURLE_OK) || (uStack_18._4_4_ != 1)) goto LAB_00134f53;
    (conn->proto).imapc.state = IMAP_AUTHENTICATE;
  }
  CVar2 = CURLE_OK;
LAB_00134f53:
  if (uStack_18._4_4_ == 0 && CVar2 == CURLE_OK) {
    cVar3 = (conn->proto).pop3c.preftype & (conn->proto).ftpc.prevmethod;
    if ((cVar3 & FTPFILE_NOCWD) == 0) {
      if ((cVar3 & FTPFILE_MULTICWD) == 0) {
        Curl_infof(conn->data,"No known authentication mechanisms supported!\n");
        CVar2 = CURLE_LOGIN_DENIED;
      }
      else {
        CVar2 = pop3_perform_user(conn);
      }
    }
    else {
      CVar2 = pop3_perform_apop(conn);
    }
  }
  return CVar2;
}

Assistant:

static CURLcode pop3_perform_authentication(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  saslprogress progress = SASL_IDLE;

  /* Check we have enough data to authenticate with and end the
     connect phase if we don't */
  if(!Curl_sasl_can_authenticate(&pop3c->sasl, conn)) {
    state(conn, POP3_STOP);
    return result;
  }

  if(pop3c->authtypes & pop3c->preftype & POP3_TYPE_SASL) {
    /* Calculate the SASL login details */
    result = Curl_sasl_start(&pop3c->sasl, conn, FALSE, &progress);

    if(!result)
      if(progress == SASL_INPROGRESS)
        state(conn, POP3_AUTH);
  }

  if(!result && progress == SASL_IDLE) {
#ifndef CURL_DISABLE_CRYPTO_AUTH
    if(pop3c->authtypes & pop3c->preftype & POP3_TYPE_APOP)
      /* Perform APOP authentication */
      result = pop3_perform_apop(conn);
    else
#endif
    if(pop3c->authtypes & pop3c->preftype & POP3_TYPE_CLEARTEXT)
      /* Perform clear text authentication */
      result = pop3_perform_user(conn);
    else {
      /* Other mechanisms not supported */
      infof(conn->data, "No known authentication mechanisms supported!\n");
      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}